

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O3

void __thiscall
geometrycentral::surface::SurfaceMesh::generateVertexIterationCache
          (SurfaceMesh *this,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *vertexIterationCacheHeIndex,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *vertexIterationCacheVertexStart,
          bool incoming,bool skipDead)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  unsigned_long uVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  unsigned_long uVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vDegree;
  vector<unsigned_long,_std::allocator<unsigned_long>_> currVertexCacheEntry;
  allocator_type local_59;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_58;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_40;
  
  local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_58,this->nVerticesFillCount,(value_type_conflict1 *)&local_40,&local_59);
  sVar7 = this->nHalfedgesFillCount;
  if (sVar7 != 0) {
    puVar1 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = 0;
    do {
      if ((!skipDead) || (puVar1[uVar5] != 0xffffffffffffffff)) {
        uVar6 = uVar5;
        if (incoming) {
          uVar6 = puVar1[uVar5];
        }
        local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[puVar2[uVar6]] =
             local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[puVar2[uVar6]] + 1;
        sVar7 = this->nHalfedgesFillCount;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < sVar7);
  }
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (vertexIterationCacheVertexStart,this->nVerticesFillCount + 1);
  puVar1 = (vertexIterationCacheVertexStart->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (this->nVerticesFillCount == 0) {
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = 0;
    do {
      puVar1[uVar6] = uVar4;
      uVar4 = uVar4 + local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar6];
      uVar5 = this->nVerticesFillCount;
      uVar6 = uVar6 + 1;
    } while (uVar6 < uVar5);
  }
  puVar1[uVar5] = uVar4;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_40,vertexIterationCacheVertexStart);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (vertexIterationCacheHeIndex,this->nHalfedgesFillCount);
  sVar7 = this->nHalfedgesFillCount;
  if (sVar7 != 0) {
    puVar1 = (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (vertexIterationCacheHeIndex->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      if ((!skipDead) || (puVar1[uVar4] != 0xffffffffffffffff)) {
        uVar8 = uVar4;
        if (incoming) {
          uVar8 = puVar1[uVar4];
        }
        uVar8 = puVar2[uVar8];
        puVar3[local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8]] = uVar4;
        local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] =
             local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8] + 1;
        sVar7 = this->nHalfedgesFillCount;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < sVar7);
  }
  if (local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SurfaceMesh::generateVertexIterationCache(std::vector<size_t>& vertexIterationCacheHeIndex,
                                               std::vector<size_t>& vertexIterationCacheVertexStart, bool incoming,
                                               bool skipDead) {

  // First, count the degree of every vertex
  std::vector<size_t> vDegree(nVerticesFillCount, 0);
  for (size_t iHe = 0; iHe < nHalfedgesFillCount; iHe++) {
    if (skipDead && halfedgeIsDead(iHe)) continue;
    size_t iV = incoming ? heVertex(heNext(iHe)) : heVertex(iHe);
    vDegree[iV]++;
  }

  // Build a sum-array of the number of vertices up to that point
  vertexIterationCacheVertexStart.resize(nVerticesFillCount + 1);
  size_t heSum = 0;
  for (size_t iV = 0; iV < nVerticesFillCount; iV++) {
    vertexIterationCacheVertexStart[iV] = heSum;
    heSum += vDegree[iV];
  }
  // add one extra element, so we can check end bound by indexing+1
  vertexIterationCacheVertexStart[nVerticesFillCount] = heSum;

  // Build a compressed array of the halfedges at each vertex
  std::vector<size_t> currVertexCacheEntry = vertexIterationCacheVertexStart;
  vertexIterationCacheHeIndex.resize(nHalfedgesFillCount);
  for (size_t iHe = 0; iHe < nHalfedgesFillCount; iHe++) {
    if (skipDead && halfedgeIsDead(iHe)) continue;
    size_t iV = incoming ? heVertex(heNext(iHe)) : heVertex(iHe);
    size_t entryInd = currVertexCacheEntry[iV];
    vertexIterationCacheHeIndex[entryInd] = iHe;
    currVertexCacheEntry[iV]++;
  }
}